

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O2

void __thiscall
spdlog::details::z_formatter<spdlog::details::scoped_padder>::format
          (z_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *tm_time,
          memory_buf_t *dest)

{
  uint uVar1;
  char local_51;
  scoped_padder p;
  
  scoped_padder::scoped_padder(&p,6,&(this->super_flag_formatter).padinfo_,dest);
  uVar1 = get_cached_offset(this,msg,tm_time);
  if ((int)uVar1 < 0) {
    local_51 = '-';
    fmt::v11::detail::buffer<char>::push_back(&dest->super_buffer<char>,&local_51);
    uVar1 = -uVar1;
  }
  else {
    local_51 = '+';
    fmt::v11::detail::buffer<char>::push_back(&dest->super_buffer<char>,&local_51);
  }
  fmt_helper::pad2(uVar1 / 0x3c,dest);
  local_51 = ':';
  fmt::v11::detail::buffer<char>::push_back(&dest->super_buffer<char>,&local_51);
  fmt_helper::pad2(uVar1 % 0x3c,dest);
  scoped_padder::~scoped_padder(&p);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &tm_time, memory_buf_t &dest) override {
        const size_t field_size = 6;
        ScopedPadder p(field_size, padinfo_, dest);

        auto total_minutes = get_cached_offset(msg, tm_time);
        bool is_negative = total_minutes < 0;
        if (is_negative) {
            total_minutes = -total_minutes;
            dest.push_back('-');
        } else {
            dest.push_back('+');
        }

        fmt_helper::pad2(total_minutes / 60, dest);  // hours
        dest.push_back(':');
        fmt_helper::pad2(total_minutes % 60, dest);  // minutes
    }